

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall
sglr::GLContext::blitFramebuffer
          (GLContext *this,int srcX0,int srcY0,int srcX1,int srcY1,int dstX0,int dstY0,int dstX1,
          int dstY1,deUint32 mask,deUint32 filter)

{
  ostringstream *this_00;
  deUint32 dVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  Bitfield<16UL> local_1e0;
  Bitfield<16UL> local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  dVar1 = this->m_drawFramebufferBinding;
  iVar5 = (this->m_baseViewport).m_data[0];
  iVar2 = (this->m_baseViewport).m_data[1];
  dVar3 = this->m_readFramebufferBinding;
  if ((this->m_logFlags & 1) != 0) {
    local_1b0._0_8_ = this->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"glBlitFramebuffer(",0x12)
    ;
    std::ostream::operator<<(this_00,srcX0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,srcY0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,srcX1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,srcY1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,dstX0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,dstY0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,dstX1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,dstY1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    glu::getBufferMaskStr(&local_1e0,mask);
    local_1c8.m_end = local_1e0.m_end;
    local_1c8.m_value = local_1e0.m_value;
    local_1c8.m_begin = local_1e0.m_begin;
    tcu::Format::Bitfield<16UL>::toStream(&local_1c8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    local_1c8.m_value = (deUint64)glu::getTextureFilterName;
    local_1c8.m_begin = (BitDesc *)CONCAT44(local_1c8.m_begin._4_4_,filter);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1c8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  iVar8 = 0;
  bVar9 = dVar3 == 0;
  iVar7 = 0;
  if (bVar9) {
    iVar7 = iVar5;
  }
  iVar6 = 0;
  if (bVar9) {
    iVar6 = iVar2;
  }
  iVar4 = iVar8;
  if (dVar1 == 0) {
    iVar8 = iVar2;
    iVar4 = iVar5;
  }
  iVar5 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0x140))
            (srcX0 + iVar7,srcY0 + iVar6,iVar7 + srcX1,iVar6 + srcY1,dstX0 + iVar4,dstY0 + iVar8,
             iVar4 + dstX1,iVar8 + dstY1,mask,filter);
  return;
}

Assistant:

void GLContext::blitFramebuffer (int srcX0, int srcY0, int srcX1, int srcY1, int dstX0, int dstY0, int dstX1, int dstY1, deUint32 mask, deUint32 filter)
{
	tcu::IVec2	drawOffset	= getDrawOffset();
	tcu::IVec2	readOffset	= getReadOffset();

	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glBlitFramebuffer("
								  << srcX0 << ", " << srcY0 << ", " << srcX1 << ", " << srcY1 << ", "
								  << dstX0 << ", " << dstY0 << ", " << dstX1 << ", " << dstY1 << ", "
								  << glu::getBufferMaskStr(mask) << ", "
								  << glu::getTextureFilterStr(filter) << ")"
			  << TestLog::EndMessage;

	m_context.getFunctions().blitFramebuffer(readOffset.x()+srcX0, readOffset.y()+srcY0, readOffset.x()+srcX1, readOffset.y()+srcY1,
											 drawOffset.x()+dstX0, drawOffset.y()+dstY0, drawOffset.x()+dstX1, drawOffset.y()+dstY1,
											 mask, filter);
}